

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
               (TestResults *results,float (*expected) [3] [3],float (*actual) [3] [3],int rows,
               int columns,float *tolerance,TestDetails *details)

{
  ostream *poVar1;
  ulong uVar2;
  char *failure;
  byte bVar3;
  float (*actual_00) [3];
  int expectedColumn;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int actualRow;
  float (*expected_00) [3];
  bool bVar7;
  MemoryOutStream stream;
  MemoryOutStream local_1c8;
  
  uVar4 = 0;
  if (0 < rows) {
    uVar4 = (ulong)(uint)rows;
  }
  bVar3 = 1;
  actual_00 = *actual;
  uVar5 = uVar4;
  expected_00 = *expected;
  while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
    bVar7 = ArrayAreClose<float[3],float[3],float>(expected_00,actual_00,columns,tolerance);
    bVar3 = bVar3 & bVar7;
    actual_00 = actual_00 + 1;
    expected_00 = expected_00 + 1;
  }
  if (bVar3 == 0) {
    MemoryOutStream::MemoryOutStream(&local_1c8);
    std::operator<<((ostream *)&local_1c8,"Expected [ ");
    uVar2 = 0;
    uVar5 = (ulong)(uint)columns;
    if (columns < 1) {
      uVar5 = uVar2;
    }
    for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
      std::operator<<((ostream *)&local_1c8,"[ ");
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        poVar1 = (ostream *)
                 std::ostream::operator<<(&local_1c8,(*(float (*) [3])(*expected)[0])[uVar6]);
        std::operator<<(poVar1," ");
      }
      std::operator<<((ostream *)&local_1c8,"] ");
      expected = (float (*) [3] [3])((long)expected + 0xc);
    }
    poVar1 = std::operator<<((ostream *)&local_1c8,"] +/- ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*tolerance);
    std::operator<<(poVar1," but was [ ");
    for (uVar2 = 0; uVar2 != uVar4; uVar2 = uVar2 + 1) {
      std::operator<<((ostream *)&local_1c8,"[ ");
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        poVar1 = (ostream *)
                 std::ostream::operator<<(&local_1c8,(*(float (*) [3])(*actual)[0])[uVar6]);
        std::operator<<(poVar1," ");
      }
      std::operator<<((ostream *)&local_1c8,"] ");
      actual = (float (*) [3] [3])((long)actual + 0xc);
    }
    std::operator<<((ostream *)&local_1c8,"]");
    failure = MemoryOutStream::GetText(&local_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c8);
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}